

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> __thiscall
duckdb_fmt::v6::
basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>::
format<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>>
          (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
           *this)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  byte *__last;
  int arg_index;
  back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> bVar5;
  InvalidInputException *this_00;
  uint uVar6;
  int iVar7;
  byte bVar8;
  byte *end;
  byte *pbVar9;
  byte bVar10;
  char *it;
  format_arg arg;
  error_handler eh;
  format_specs specs;
  byte *local_c0;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_90;
  format_specs local_6c;
  basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
  *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  bVar5.container = *(buffer<char> **)this;
  local_c0 = *(byte **)(this + 0x18);
  pbVar9 = local_c0;
  if (*(long *)(this + 0x20) != 0) {
    local_58 = this + 0x18;
    end = local_c0 + *(long *)(this + 0x20);
    do {
      pbVar1 = local_c0 + 1;
      if (*local_c0 != 0x25) goto LAB_003b02ab;
      if ((pbVar1 != end) && (*pbVar1 == 0x25)) {
        local_c0 = pbVar1;
        bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                          ((char *)pbVar9,(char *)pbVar1,bVar5);
        pbVar9 = local_c0 + 1;
        pbVar1 = pbVar9;
        goto LAB_003b02ab;
      }
      __last = local_c0;
      local_c0 = pbVar1;
      bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                        ((char *)pbVar9,(char *)__last,bVar5);
      local_6c.width = 0;
      local_6c.precision = -1;
      local_6c._8_2_ = 0x200;
      local_6c.fill.data_[4] = '\0';
      local_6c.fill.data_[5] = '\0';
      local_6c.fill.data_[0] = ' ';
      local_6c.fill.data_[1] = '\0';
      local_6c.fill.data_[2] = '\0';
      local_6c.fill.data_[3] = '\0';
      local_6c.thousands = '\0';
      arg_index = basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                  ::parse_header((basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                                  *)this,(char **)&local_c0,(char *)end,&local_6c);
      if (arg_index == 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"argument index out of range","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_50,local_50 + local_48);
        local_b8.pointer = &local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        internal::error_handler::on_error((error_handler *)local_58,(string *)&local_b8.string);
      }
      bVar2 = 1;
      if ((local_c0 != end) && (*local_c0 == 0x2e)) {
        pbVar9 = local_c0 + 1;
        if (pbVar9 == end) {
          iVar7 = 0;
        }
        else {
          iVar7 = (int)(char)*pbVar9;
        }
        if (iVar7 - 0x30U < 10) {
          if (*pbVar9 == 0x30) {
            local_c0 = local_c0 + 2;
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            pbVar1 = local_c0 + 2;
            local_c0 = pbVar9;
            while (pbVar9 = pbVar1, uVar6 < 0xccccccd) {
              uVar6 = ((int)(char)pbVar9[-1] + uVar6 * 10) - 0x30;
              local_c0 = pbVar9;
              if ((pbVar9 == end) || (pbVar1 = pbVar9 + 1, 9 < (byte)(*pbVar9 - 0x30)))
              goto LAB_003b0069;
            }
            uVar6 = 0x80000000;
LAB_003b0069:
            if ((int)uVar6 < 0) {
              local_b8.pointer = &local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"number is too big","");
              internal::error_handler::on_error
                        ((error_handler *)&local_90,(string *)&local_b8.string);
            }
          }
          local_6c.precision = uVar6;
        }
        else if (iVar7 == 0x2a) {
          local_c0 = local_c0 + 2;
          basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          ::get_arg((format_arg *)&local_b8.string,
                    (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                     *)this,-1);
          iVar7 = visit_format_arg<duckdb_fmt::v6::internal::printf_precision_handler,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                            ((printf_precision_handler *)&local_90,
                             (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                              *)&local_b8.string);
          local_6c.precision = iVar7;
        }
        else {
          local_6c._0_8_ = local_6c._0_8_ & 0xffffffff;
          bVar2 = 0;
          local_c0 = pbVar9;
        }
      }
      basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
      ::get_arg((format_arg *)&local_b8.string,
                (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                 *)this,arg_index);
      uVar3 = local_b8.bool_value;
      if ((short)local_6c._8_2_ < 0) {
        switch(local_a8._M_allocated_capacity._0_4_) {
        case 2:
        case 3:
          bVar10 = local_b8.int_value == 0;
          break;
        case 4:
        case 5:
          bVar10 = local_b8.long_long_value == 0;
          break;
        default:
          goto switchD_003b00a7_caseD_6;
        case 8:
          bVar10 = local_b8.char_value ^ 1;
          break;
        case 9:
          bVar10 = local_b8.bool_value == false;
        }
        if (bVar10 != 0) {
          local_6c._8_2_ = local_6c._8_2_ & 0x7fff;
        }
      }
switchD_003b00a7_caseD_6:
      if (local_6c.fill.data_[0] == '0') {
        if (local_a8._M_allocated_capacity._0_4_ - 1 < 0xc) {
          local_6c._8_2_ = local_6c._8_2_ & 0xf0ff | 0x400;
        }
        else {
          local_6c.fill.data_[0] = ' ';
        }
      }
      if (local_c0 == end) {
        bVar10 = 0;
      }
      else {
        bVar10 = *local_c0;
        local_c0 = local_c0 + 1;
      }
      if (local_c0 == end) {
        bVar8 = 0;
      }
      else {
        bVar8 = *local_c0;
      }
      if (0x6b < bVar10) {
        if (bVar10 == 0x6c) {
          if (bVar8 != 0x6c) goto LAB_003b0185;
          local_c0 = local_c0 + 1;
          if (local_c0 == end) {
            bVar10 = 0;
          }
          else {
            bVar10 = *local_c0;
          }
          local_90._M_dataplus._M_p = (pointer)&local_b8;
          local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,bVar10);
          visit_format_arg<duckdb_fmt::v6::internal::arg_converter<long_long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((arg_converter<long_long,_duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_90,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)local_90._M_dataplus._M_p);
        }
        else if (bVar10 == 0x74) {
LAB_003b0185:
          local_90._M_dataplus._M_p = (pointer)&local_b8;
          local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,bVar8);
          visit_format_arg<duckdb_fmt::v6::internal::arg_converter<long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((arg_converter<long,_duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_90,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)local_90._M_dataplus._M_p);
        }
        else {
          if (bVar10 != 0x7a) goto LAB_003b01e9;
          local_90._M_dataplus._M_p = (pointer)&local_b8;
          local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,bVar8);
          visit_format_arg<duckdb_fmt::v6::internal::arg_converter<unsigned_long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((arg_converter<unsigned_long,_duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_90,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)local_90._M_dataplus._M_p);
        }
        goto switchD_003b020b_caseD_6;
      }
      if (bVar10 == 0x4c) goto switchD_003b020b_caseD_6;
      if (bVar10 == 0x68) {
        if (bVar8 == 0x68) {
          local_c0 = local_c0 + 1;
          if (local_c0 == end) {
            bVar10 = 0;
          }
          else {
            bVar10 = *local_c0;
          }
          local_90._M_dataplus._M_p = (pointer)&local_b8;
          local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,bVar10);
          visit_format_arg<duckdb_fmt::v6::internal::arg_converter<signed_char,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((arg_converter<signed_char,_duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_90,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)local_90._M_dataplus._M_p);
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_b8;
          local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,bVar8);
          visit_format_arg<duckdb_fmt::v6::internal::arg_converter<short,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((arg_converter<short,_duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_90,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)local_90._M_dataplus._M_p);
        }
        goto switchD_003b020b_caseD_6;
      }
      if (bVar10 == 0x6a) goto LAB_003b0185;
LAB_003b01e9:
      local_c0 = local_c0 + -1;
      switch(local_a8._M_allocated_capacity._0_4_) {
      case 2:
      case 3:
        if ((bVar10 != 0x69) && (bVar10 != 100)) {
LAB_003b0393:
          local_a8._M_allocated_capacity._0_4_ = 3;
          break;
        }
        goto LAB_003b0375;
      case 4:
      case 5:
        if ((bVar10 == 0x69) || (bVar10 == 100)) {
          local_a8._M_allocated_capacity._0_4_ = 4;
        }
        else {
          local_a8._M_allocated_capacity._0_4_ = 5;
        }
        break;
      case 8:
        uVar6 = CONCAT31(0,uVar3);
        if (bVar10 != 100) {
          if (bVar10 == 0x73) break;
          if (bVar10 != 0x69) {
            local_b8.int_value = uVar6;
            goto LAB_003b0393;
          }
        }
        goto LAB_003b0371;
      case 9:
        uVar6 = (uint)(char)uVar3;
        if ((bVar10 != 0x69) && (bVar10 != 100)) {
          local_b8.int_value._1_3_ = 0;
          local_b8.int_value = CONCAT31(local_b8._1_3_,uVar3);
          goto LAB_003b0393;
        }
LAB_003b0371:
        local_b8.int_value = uVar6;
LAB_003b0375:
        local_a8._M_allocated_capacity._0_4_ = 2;
      }
switchD_003b020b_caseD_6:
      uVar4 = local_b8.ulong_long_value;
      if (local_c0 == end) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"invalid format string","");
        duckdb::InvalidInputException::InvalidInputException(this_00,&local_90);
        __cxa_throw(this_00,&duckdb::InvalidInputException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      pbVar9 = local_c0 + 1;
      bVar10 = *local_c0;
      local_6c.type = bVar10;
      if (local_a8._M_allocated_capacity._0_4_ - 1 < 9) {
        if (bVar10 == 99) {
          switch(local_a8._M_allocated_capacity._0_4_) {
          case 2:
          case 3:
          case 4:
          case 5:
          case 8:
          case 9:
            local_b8.int_value._1_3_ = 0;
            local_b8.long_long_value._4_4_ = SUB84(uVar4,4);
            local_a8._M_allocated_capacity._0_4_ = 9;
          }
        }
        else if ((bVar10 == 0x75) || (bVar10 == 0x69)) {
          local_6c.type = 'd';
        }
      }
      if (!(bool)(bVar2 | local_6c.type != 'd')) {
        local_6c.thousands = '.';
      }
      local_90._M_string_length = 0;
      local_c0 = pbVar9;
      local_90._M_dataplus._M_p = (pointer)bVar5;
      local_90.field_2._M_allocated_capacity = (size_type)&local_6c;
      local_90.field_2._8_8_ = this;
      visit_format_arg<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                ((printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>_> *)&local_90,
                 (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                  *)&local_b8.string);
      pbVar1 = local_c0;
LAB_003b02ab:
      local_c0 = pbVar1;
    } while (local_c0 != end);
  }
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                    ((char *)pbVar9,(char *)local_c0,bVar5);
  return (back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>)bVar5.container;
}

Assistant:

OutputIt out() { return out_; }